

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

void output(code_int code,GifCtx *ctx)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = ctx->cur_bits;
  if ((long)iVar3 == -1000) {
    return;
  }
  uVar1 = (long)code << ((byte)iVar3 & 0x3f) | ctx->cur_accum & masks[iVar3];
  if (iVar3 < 1) {
    uVar1 = (long)code;
  }
  ctx->cur_accum = uVar1;
  iVar3 = ctx->n_bits + iVar3;
  ctx->cur_bits = iVar3;
  if (7 < iVar3) {
    do {
      iVar3 = ctx->a_count;
      ctx->a_count = iVar3 + 1;
      ctx->accum[iVar3] = (char)uVar1;
      if (0xfd < ctx->a_count) {
        flush_char(ctx);
      }
      uVar1 = ctx->cur_accum >> 8;
      ctx->cur_accum = uVar1;
      iVar2 = ctx->cur_bits;
      iVar3 = iVar2 + -8;
      ctx->cur_bits = iVar3;
    } while (0xf < iVar2);
  }
  if (ctx->maxcode < ctx->free_ent) {
    if (ctx->clear_flg == 0) {
      iVar2 = ctx->n_bits + 1;
      ctx->n_bits = iVar2;
      if (iVar2 == 0xc) {
        ctx->maxcode = 0x1000;
      }
      else {
        ctx->maxcode = ~(-1 << ((byte)iVar2 & 0x1f));
      }
      goto LAB_00118c01;
    }
  }
  else if (ctx->clear_flg == 0) goto LAB_00118c01;
  ctx->n_bits = ctx->g_init_bits;
  ctx->maxcode = ~(-1 << ((byte)ctx->g_init_bits & 0x1f));
  ctx->clear_flg = 0;
LAB_00118c01:
  if (ctx->EOFCode != code) {
    return;
  }
  if (0 < iVar3) {
    do {
      iVar3 = ctx->a_count;
      ctx->a_count = iVar3 + 1;
      ctx->accum[iVar3] = (char)uVar1;
      if (0xfd < ctx->a_count) {
        flush_char(ctx);
      }
      uVar1 = ctx->cur_accum >> 8;
      ctx->cur_accum = uVar1;
      iVar3 = ctx->cur_bits;
      ctx->cur_bits = iVar3 + -8;
    } while (8 < iVar3);
  }
  ctx->cur_bits = -1000;
  flush_char(ctx);
  return;
}

Assistant:

static void output(code_int code, GifCtx *ctx)
{
	if (ctx->cur_bits == CUR_BITS_FINISHED)
		return;
	ctx->cur_accum &= masks[ctx->cur_bits];

	if(ctx->cur_bits > 0) {
		ctx->cur_accum |= ((long)code << ctx->cur_bits);
	} else {
		ctx->cur_accum = code;
	}

	ctx->cur_bits += ctx->n_bits;

	while(ctx->cur_bits >= 8) {
		char_out((unsigned int)(ctx->cur_accum & 0xff), ctx);
		ctx->cur_accum >>= 8;
		ctx->cur_bits -= 8;
	}

	/*
	 * If the next entry is going to be too big for the code size,
	 * then increase it, if possible.
	 */
	if(ctx->free_ent > ctx->maxcode || ctx->clear_flg) {
		if(ctx->clear_flg) {
			ctx->maxcode = MAXCODE (ctx->n_bits = ctx->g_init_bits);
			ctx->clear_flg = 0;
		} else {
			++(ctx->n_bits);
			if(ctx->n_bits == maxbits) {
				ctx->maxcode = maxmaxcode;
			} else {
				ctx->maxcode = MAXCODE(ctx->n_bits);
			}
		}
	}

	if(code == ctx->EOFCode) {
		/* At EOF, write the rest of the buffer. */
		while(ctx->cur_bits > 0) {
			char_out((unsigned int)(ctx->cur_accum & 0xff), ctx);
			ctx->cur_accum >>= 8;
			ctx->cur_bits -= 8;
		}
		/* Flag that it's done to prevent re-entry. */
		ctx->cur_bits = CUR_BITS_FINISHED;

		flush_char(ctx);
	}
}